

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O2

void __thiscall PartVolumeButton::toggleSoloPart(PartVolumeButton *this,bool enabled)

{
  PartVolumeButton *this_00;
  int i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 != 9; uVar1 = uVar1 + 1) {
    this_00 = this->monitor->partVolumeButton[uVar1];
    if ((enabled) && (uVar1 != (uint)this->partNum)) {
      mutePart(this_00);
    }
    else {
      unmutePart(this_00);
    }
  }
  return;
}

Assistant:

void PartVolumeButton::toggleSoloPart(bool enabled) {
	for (int i = 0; i < 9; i++) {
		if (enabled && i != partNum) {
			monitor.partVolumeButton[i]->mutePart();
		} else {
			monitor.partVolumeButton[i]->unmutePart();
		}
	}
}